

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSSBOLayoutCase.cpp
# Opt level: O3

string * __thiscall
deqp::gles31::bb::(anonymous_namespace)::getAPIName_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,BufferBlock *block,
          BufferVar *var,TypeComponentVector *accessPath)

{
  _Alloc_hider __s;
  undefined8 uVar1;
  size_t sVar2;
  VarTypeComponent *pVVar3;
  ostringstream *poVar4;
  string *psVar5;
  long lVar6;
  char *pcVar7;
  __normal_iterator<const_glu::VarTypeComponent_*,_std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>_>
  begin;
  VarType curType;
  ostringstream name;
  string *local_1c8;
  VarType local_1c0;
  undefined1 local_1a8 [376];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  if ((*(long *)(this + 0x28) != 0) && (*(long *)(this + 0x20) != 0)) {
    pcVar7 = *(char **)this;
    if (pcVar7 == (char *)0x0) {
      std::ios::clear((int)&local_1c8 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18) + 0x20);
    }
    else {
      sVar2 = strlen(pcVar7);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar7,sVar2);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,".",1);
  }
  pcVar7 = (block->m_blockName)._M_dataplus._M_p;
  if (pcVar7 == (char *)0x0) {
    std::ios::clear((int)&local_1c8 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18) + 0x20);
  }
  else {
    sVar2 = strlen(pcVar7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar7,sVar2);
  }
  begin._M_current = (VarTypeComponent *)(var->m_name)._M_dataplus._M_p;
  pVVar3 = (VarTypeComponent *)(var->m_name)._M_string_length;
  local_1c8 = __return_storage_ptr__;
  if (begin._M_current != pVVar3) {
    do {
      if ((begin._M_current)->type == ARRAY_ELEMENT) {
        lVar6 = 3;
        poVar4 = (ostringstream *)local_1a8;
        if (begin._M_current + 1 == pVVar3) {
          pcVar7 = "[0]";
        }
        else {
          pcVar7 = "[0]";
          if (begin._M_current != (VarTypeComponent *)(var->m_name)._M_dataplus._M_p) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[",1);
            poVar4 = (ostringstream *)
                     std::ostream::operator<<((ostringstream *)local_1a8,(begin._M_current)->index);
            lVar6 = 1;
            pcVar7 = "]";
          }
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4,pcVar7,lVar6);
      }
      else if ((begin._M_current)->type == STRUCT_MEMBER) {
        glu::
        getVarType<__gnu_cxx::__normal_iterator<glu::VarTypeComponent_const*,std::vector<glu::VarTypeComponent,std::allocator<glu::VarTypeComponent>>>>
                  (&local_1c0,(glu *)&block->m_instanceName,
                   (VarType *)(var->m_name)._M_dataplus._M_p,begin,
                   (__normal_iterator<const_glu::VarTypeComponent_*,_std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>_>
                    )accessPath);
        uVar1 = local_1c0.m_data.basic;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,".",1);
        __s._M_p = (((StructType *)uVar1)->m_members).
                   super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>._M_impl
                   .super__Vector_impl_data._M_start[(begin._M_current)->index].m_name._M_dataplus.
                   _M_p;
        if (__s._M_p == (char *)0x0) {
          std::ios::clear((int)&local_1c8 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18) + 0x20);
        }
        else {
          sVar2 = strlen(__s._M_p);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,__s._M_p,sVar2);
        }
        glu::VarType::~VarType(&local_1c0);
      }
      begin._M_current = begin._M_current + 1;
      pVVar3 = (VarTypeComponent *)(var->m_name)._M_string_length;
    } while (begin._M_current != pVVar3);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  psVar5 = (string *)std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  return psVar5;
}

Assistant:

string getAPIName (const BufferBlock& block, const BufferVar& var, const glu::TypeComponentVector& accessPath)
{
	std::ostringstream name;

	if (block.getInstanceName())
		name << block.getBlockName() << ".";

	name << var.getName();

	for (glu::TypeComponentVector::const_iterator pathComp = accessPath.begin(); pathComp != accessPath.end(); pathComp++)
	{
		if (pathComp->type == glu::VarTypeComponent::STRUCT_MEMBER)
		{
			const VarType		curType		= glu::getVarType(var.getType(), accessPath.begin(), pathComp);
			const StructType*	structPtr	= curType.getStructPtr();

			name << "." << structPtr->getMember(pathComp->index).getName();
		}
		else if (pathComp->type == glu::VarTypeComponent::ARRAY_ELEMENT)
		{
			if (pathComp == accessPath.begin() || (pathComp+1) == accessPath.end())
				name << "[0]"; // Top- / bottom-level array
			else
				name << "[" << pathComp->index << "]";
		}
		else
			DE_ASSERT(false);
	}

	return name.str();
}